

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressor.c
# Opt level: O1

int mixed_make_segment_compressor(uint32_t samplerate,mixed_segment *segment)

{
  compressor_segment_data *data;
  
  data = (compressor_segment_data *)(*mixed_calloc)(1,0x10a0);
  if (data == (compressor_segment_data *)0x0) {
    mixed_err(1);
  }
  else {
    data->samplerate = samplerate;
    data->pregain = 0.0;
    data->threshold = -24.0;
    data->knee = 30.0;
    data->ratio = 12.0;
    data->attack = 0.003;
    data->release = 0.25;
    data->predelay = 0.006;
    data->releasezone[0] = 0.09;
    data->releasezone[1] = 0.16;
    data->releasezone[2] = 0.42;
    data->releasezone[3] = 0.96;
    data->postgain = 0.0;
    data->wet = 1.0;
    compressor_reinit(data);
    segment->start = compressor_segment_start;
    segment->mix = (_func_int_mixed_segment_ptr *)&LAB_001050d0;
    segment->set_in = compressor_segment_set_in;
    segment->set_out = compressor_segment_set_out;
    segment->info = compressor_segment_info;
    segment->get = compressor_segment_get;
    segment->set = compressor_segment_set;
    segment->data = data;
  }
  return (uint)(data != (compressor_segment_data *)0x0);
}

Assistant:

MIXED_EXPORT int mixed_make_segment_compressor(uint32_t samplerate, struct mixed_segment *segment){
  struct compressor_segment_data *data = mixed_calloc(1, sizeof(struct compressor_segment_data));
  if(!data){
    mixed_err(MIXED_OUT_OF_MEMORY);
    return 0;
  }

  data->samplerate = samplerate;
  data->pregain = 0.0;
  data->threshold = -24;
  data->knee = 30;
  data->ratio = 12;
  data->attack = 0.003;
  data->release = 0.25;
  data->predelay = 0.006;
  data->releasezone[0] = 0.09;
  data->releasezone[1] = 0.16;
  data->releasezone[2] = 0.42;
  data->releasezone[3] = 0.96;
  data->postgain = 0;
  data->wet = 1;

  compressor_reinit(data);
  
  segment->start = compressor_segment_start;
  segment->mix = compressor_segment_mix;
  segment->set_in = compressor_segment_set_in;
  segment->set_out = compressor_segment_set_out;
  segment->info = compressor_segment_info;
  segment->get = compressor_segment_get;
  segment->set = compressor_segment_set;
  segment->data = data;
  return 1;
}